

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockExpectedCall_callWithThreeDifferentParameter_TestShell::createTest
          (TEST_MockExpectedCall_callWithThreeDifferentParameter_TestShell *this)

{
  TEST_MockExpectedCall_callWithThreeDifferentParameter_Test *this_00;
  TEST_MockExpectedCall_callWithThreeDifferentParameter_TestShell *this_local;
  
  this_00 = (TEST_MockExpectedCall_callWithThreeDifferentParameter_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x1bc);
  TEST_MockExpectedCall_callWithThreeDifferentParameter_Test::
  TEST_MockExpectedCall_callWithThreeDifferentParameter_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callWithThreeDifferentParameter)
{
    call->withParameter("integer", 1);
    call->withParameter("string", "hello world");
    call->withParameter("double", 0.12);
    STRCMP_EQUAL("int", call->getInputParameterType("integer").asCharString());
    STRCMP_EQUAL("const char*", call->getInputParameterType("string").asCharString());
    STRCMP_EQUAL("double", call->getInputParameterType("double").asCharString());
    LONGS_EQUAL(1, call->getInputParameter("integer").getIntValue());
    STRCMP_EQUAL("hello world", call->getInputParameter("string").getStringValue());
    DOUBLES_EQUAL(0.12, call->getInputParameter("double").getDoubleValue(), 0.05);
}